

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

SharedSyPtr front::symbol::IntSymbol::getHolderIntSymbol(void)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SharedSyPtr SVar2;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  allocator<char> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 is_const;
  int in_stack_ffffffffffffffe4;
  string *in_stack_ffffffffffffffe8;
  IntSymbol *in_stack_fffffffffffffff0;
  
  if (getHolderIntSymbol()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&getHolderIntSymbol()::holder);
    if (iVar1 != 0) {
      operator_new(0x40);
      in_stack_ffffffffffffffa0 = &local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0);
      is_const = (undefined1)((uint)in_stack_ffffffffffffffe0 >> 0x18);
      in_stack_ffffffffffffff9c = Symbol::getNoLayerNum();
      IntSymbol(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                (bool)is_const,in_stack_ffffffffffffffdc);
      std::shared_ptr<front::symbol::Symbol>::shared_ptr<front::symbol::IntSymbol,void>
                ((shared_ptr<front::symbol::Symbol> *)in_stack_ffffffffffffffa0,
                 (IntSymbol *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(std::shared_ptr<front::symbol::Symbol>::~shared_ptr,&getHolderIntSymbol::holder,
                   &__dso_handle);
      __cxa_guard_release(&getHolderIntSymbol()::holder);
    }
  }
  std::shared_ptr<front::symbol::Symbol>::shared_ptr
            ((shared_ptr<front::symbol::Symbol> *)in_stack_ffffffffffffffa0,
             (shared_ptr<front::symbol::Symbol> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedSyPtr)SVar2.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SharedSyPtr getHolderIntSymbol() {
    static SharedSyPtr holder(
        new IntSymbol("holder", Symbol::getNoLayerNum(), true));
    return holder;
  }